

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

bool libtorrent::anon_unknown_1::extract_files2
               (bdecode_node *tree,file_storage *target,string *root_dir,ptrdiff_t info_offset,
               char *info_buffer,bool has_files,int depth,error_code *ec)

{
  pointer pcVar1;
  string_view symlink_path_00;
  void *pvVar2;
  size_type sVar3;
  byte bVar4;
  file_flags_t file_flags;
  type_t tVar5;
  int iVar6;
  int iVar7;
  ptrdiff_t pVar8;
  error_code *peVar9;
  char *pcVar10;
  bool bVar11;
  undefined7 in_register_00000089;
  error_code *__s2;
  string *path_00;
  bool bVar12;
  string_view key;
  string_view key_00;
  error_code eVar13;
  string_view sVar14;
  string_view key_01;
  string_view element;
  string_view key_02;
  string_view filename;
  string path;
  string symlink_path;
  bdecode_node s_p;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> e;
  string local_268;
  int local_248;
  undefined4 local_244;
  bdecode_token *local_240;
  pointer local_238;
  bdecode_token local_230 [2];
  ulong local_220;
  file_storage *local_218;
  bdecode_node local_210;
  int64_t local_1d0;
  char *local_1c8;
  string *local_1c0;
  long *local_1b8;
  string *local_1b0;
  long local_1a8 [2];
  bdecode_node local_198;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_150;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> local_100;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_80;
  
  local_244 = (undefined4)CONCAT71(in_register_00000089,has_files);
  peVar9 = (error_code *)info_offset;
  tVar5 = bdecode_node::type(tree);
  if (tVar5 == dict_t) {
    if (depth < 0x65) {
      local_218 = target;
      iVar6 = bdecode_node::dict_size(tree);
      bVar11 = iVar6 < 1;
      if (iVar6 < 1) {
        return bVar11;
      }
      iVar6 = 0;
      local_1c0 = root_dir;
      do {
        bdecode_node::dict_at_node(&local_100,tree,iVar6);
        tVar5 = bdecode_node::type(&local_100.second);
        if ((tVar5 == dict_t) &&
           (sVar14 = bdecode_node::string_value(&local_100.first), sVar14._M_len != 0)) {
          pVar8 = bdecode_node::string_offset(&local_100.first);
          iVar7 = bdecode_node::string_length(&local_100.first);
          __s2 = (error_code *)(info_buffer + (pVar8 - info_offset));
          path_00 = (string *)(long)iVar7;
          if (iVar7 != 0) {
            do {
              if ((char)__s2->val_ != '/') goto LAB_003756d2;
              __s2 = (error_code *)((long)&__s2->val_ + 1);
              path_00 = (string *)((long)&path_00[-1].field_2 + 0xf);
            } while (path_00 != (string *)0x0);
            path_00 = (string *)0x0;
          }
LAB_003756d2:
          iVar7 = bdecode_node::dict_size(&local_100.second);
          if (iVar7 == 1) {
            bdecode_node::dict_at(&local_80,&local_100.second,0);
            bVar12 = local_80.first._M_len == 0;
          }
          else {
            bVar12 = false;
          }
          if ((iVar7 == 1) &&
             (local_80.second.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_80.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.second.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.second.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((bVar12 && (char)local_244 == '\0') &&
             (iVar7 = bdecode_node::dict_size(tree), iVar7 == 1)) {
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            local_268._M_string_length = 0;
            local_268.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            pcVar1 = (local_1c0->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_268,pcVar1,pcVar1 + local_1c0->_M_string_length);
          }
          sVar14._M_str = (char *)peVar9;
          sVar14._M_len = (size_t)__s2;
          aux::sanitize_append_path_element((aux *)&local_268,path_00,sVar14);
          sVar3 = local_268._M_string_length;
          if (bVar12) {
            bVar12 = true;
            if (path_00 <= local_268._M_string_length) {
              peVar9 = (error_code *)0xffffffffffffffff;
              ::std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_268);
              if (local_1b0 == path_00) {
                if (local_1b0 == (string *)0x0) {
                  bVar12 = false;
                }
                else {
                  iVar7 = bcmp(local_1b8,__s2,(size_t)local_1b0);
                  bVar12 = iVar7 != 0;
                }
              }
            }
            if ((path_00 <= sVar3) && (local_1b8 != local_1a8)) {
              operator_delete(local_1b8,local_1a8[0] + 1);
            }
            if (bVar12) {
              __s2 = (error_code *)0x0;
              path_00 = (string *)0x0;
            }
            bdecode_node::dict_at(&local_150,&local_100.second,0);
            tVar5 = bdecode_node::type(&local_150.second);
            bVar4 = 1;
            if (tVar5 == dict_t) {
              file_flags = get_file_attributes(&local_150.second);
              if ((file_flags.m_val & 1) == 0) {
                if ((file_flags.m_val & 8) == 0) {
                  key._M_str = "length";
                  key._M_len = 6;
                  local_220 = bdecode_node::dict_find_int_value(&local_150.second,key,-1);
                }
                else {
                  local_220 = 0;
                }
                if (local_220 >> 0xe < 0x3fffffff) {
                  key_00._M_str = "mtime";
                  key_00._M_len = 5;
                  local_1d0 = bdecode_node::dict_find_int_value(&local_150.second,key_00,0);
                  local_240 = local_230;
                  local_238 = (pointer)0x0;
                  local_230[0]._0_1_ = 0;
                  if ((file_flags.m_val & 8) == 0) {
LAB_00375b55:
                    if (local_220 == 0) {
                      pcVar10 = (char *)0x0;
                    }
                    else {
                      pcVar10 = (char *)0x0;
                      if (local_238 == (pointer)0x0) {
                        key_02._M_str = "pieces root";
                        key_02._M_len = 0xb;
                        bdecode_node::dict_find_string(&local_210,&local_150.second,key_02);
                        bVar12 = bdecode_node::operator_cast_to_bool(&local_210);
                        if ((bVar12) && (tVar5 = bdecode_node::type(&local_210), tVar5 == string_t))
                        {
                          iVar7 = bdecode_node::string_length(&local_210);
                          if (iVar7 != 0x20) goto LAB_00375bfc;
                          pVar8 = bdecode_node::string_offset(&local_210);
                          pcVar10 = info_buffer + (pVar8 - info_offset);
                          if (info_buffer == (char *)0x0) {
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_198.m_root_tokens = (bdecode_token *)0x0;
                          }
                          else {
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)pcVar10
                            ;
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                                 *(undefined4 *)(pcVar10 + 4);
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                                 *(undefined4 *)(pcVar10 + 8);
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                                 *(undefined4 *)(pcVar10 + 0xc);
                            local_198.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)(pcVar10 + 0x10);
                            local_198.m_root_tokens = *(bdecode_token **)(pcVar10 + 0x18);
                          }
                          peVar9 = (error_code *)info_buffer;
                          bVar12 = digest32<256L>::is_all_zeros((digest32<256L> *)&local_198);
                          bVar12 = !bVar12;
                          if (!bVar12) {
                            boost::system::error_code::operator=(ec,torrent_missing_pieces_root);
                          }
                        }
                        else {
LAB_00375bfc:
                          eVar13 = errors::make_error_code(torrent_missing_pieces_root);
                          ec->val_ = eVar13.val_;
                          ec->failed_ = eVar13.failed_;
                          *(int3 *)&ec->field_0x5 = eVar13._5_3_;
                          ec->cat_ = eVar13.cat_;
                          pcVar10 = (char *)0x0;
                          bVar12 = false;
                          peVar9 = ec;
                        }
                        if (local_210.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_210.m_tokens.
                                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_210.m_tokens.
                                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_210.m_tokens.
                                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        bVar4 = 1;
                        if (!bVar12) goto LAB_00375cc6;
                      }
                    }
                    local_210.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start = local_238;
                    local_210.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish = local_240;
                    symlink_path_00._M_str = (char *)local_240;
                    symlink_path_00._M_len = (size_t)local_238;
                    filename._M_str = (char *)__s2;
                    filename._M_len = (size_t)path_00;
                    file_storage::add_file_borrow
                              (local_218,ec,filename,&local_268,local_220,file_flags,local_1d0,
                               symlink_path_00,pcVar10);
                    bVar4 = (ec->failed_ ^ 1U) * '\x03' + 1;
                    peVar9 = __s2;
                  }
                  else {
                    key_01._M_str = "symlink path";
                    key_01._M_len = 0xc;
                    bdecode_node::dict_find_list(&local_210,&local_150.second,key_01);
                    bVar12 = bdecode_node::operator_cast_to_bool(&local_210);
                    if (!bVar12) {
LAB_00375b38:
                      if (local_210.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_210.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_210.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_210.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      goto LAB_00375b55;
                    }
                    path_length(&local_210,ec);
                    if (ec->failed_ == false) {
                      peVar9 = ec;
                      ::std::__cxx11::string::reserve((ulong)&local_240);
                      local_248 = bdecode_node::list_size(&local_210);
                      if (0 < local_248) {
                        iVar7 = 0;
                        do {
                          bdecode_node::list_at(&local_198,&local_210,iVar7);
                          sVar14 = bdecode_node::string_value(&local_198);
                          pvVar2 = (void *)CONCAT44(local_198.m_tokens.
                                                                                                        
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_198.m_tokens.
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
                          pcVar10 = sVar14._M_str;
                          if (pvVar2 != (void *)0x0) {
                            local_1c8 = sVar14._M_str;
                            operator_delete(pvVar2,(long)local_198.m_tokens.
                                                                                                                  
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)pvVar2);
                            pcVar10 = local_1c8;
                          }
                          element._M_str = (char *)peVar9;
                          element._M_len = (size_t)pcVar10;
                          aux::sanitize_append_path_element
                                    ((aux *)&local_240,(string *)sVar14._M_len,element);
                          iVar7 = iVar7 + 1;
                        } while (local_248 != iVar7);
                      }
                      goto LAB_00375b38;
                    }
                    peVar9 = ec;
                    if (local_210.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_210.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_210.m_tokens.
                                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_210.m_tokens.
                                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    bVar4 = 1;
                  }
LAB_00375cc6:
                  if (local_240 != local_230) {
                    operator_delete(local_240,CONCAT71(local_230[0]._1_7_,local_230[0]._0_1_) + 1);
                  }
                  goto LAB_00375940;
                }
                eVar13 = errors::make_error_code(torrent_invalid_length);
              }
              else {
                eVar13 = errors::make_error_code(torrent_invalid_pad_file);
              }
              ec->val_ = eVar13.val_;
              ec->failed_ = eVar13.failed_;
              *(int3 *)&ec->field_0x5 = eVar13._5_3_;
              ec->cat_ = eVar13.cat_;
              peVar9 = ec;
            }
LAB_00375940:
            if (local_150.second.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_150.second.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_150.second.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_150.second.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            peVar9 = (error_code *)info_offset;
            bVar12 = extract_files2(&local_100.second,local_218,&local_268,info_offset,info_buffer,
                                    true,depth + 1,ec);
            bVar4 = !bVar12;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,
                            CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                     local_268.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          eVar13 = errors::make_error_code(torrent_file_parse_failed);
          ec->val_ = eVar13.val_;
          ec->failed_ = eVar13.failed_;
          *(int3 *)&ec->field_0x5 = eVar13._5_3_;
          ec->cat_ = eVar13.cat_;
          bVar4 = 1;
          peVar9 = ec;
        }
        if (local_100.second.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.second.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_100.second.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_100.second.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_100.first.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.first.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_100.first.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_100.first.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((bVar4 & 3) != 0) {
          return bVar11;
        }
        iVar6 = iVar6 + 1;
        iVar7 = bdecode_node::dict_size(tree);
        bVar11 = iVar7 <= iVar6;
        if (iVar7 <= iVar6) {
          return bVar11;
        }
      } while( true );
    }
    eVar13 = errors::make_error_code(torrent_file_parse_failed);
  }
  else {
    eVar13 = errors::make_error_code(torrent_file_parse_failed);
  }
  ec->val_ = eVar13.val_;
  ec->failed_ = eVar13.failed_;
  *(int3 *)&ec->field_0x5 = eVar13._5_3_;
  ec->cat_ = eVar13.cat_;
  return false;
}

Assistant:

bool extract_files2(bdecode_node const& tree, file_storage& target
		, std::string const& root_dir, ptrdiff_t const info_offset
		, char const* info_buffer
		, bool const has_files, int const depth, error_code& ec)
	{
		if (tree.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		// since we're parsing this recursively, we have to be careful not to blow
		// up the stack. 100 levels of sub directories should be enough. This
		// could be improved by an iterative parser, keeping the state on a more
		// compact side-stack
		if (depth > 100)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		for (int i = 0; i < tree.dict_size(); ++i)
		{
			auto e = tree.dict_at_node(i);
			if (e.second.type() != bdecode_node::dict_t || e.first.string_value().empty())
			{
				ec = errors::torrent_file_parse_failed;
				return false;
			}

			string_view filename = { info_buffer + (e.first.string_offset() - info_offset)
				, static_cast<size_t>(e.first.string_length()) };
			while (!filename.empty() && filename.front() == TORRENT_SEPARATOR)
				filename.remove_prefix(1);

			bool const leaf_node = e.second.dict_size() == 1 && e.second.dict_at(0).first.empty();
			bool const single_file = leaf_node && !has_files && tree.dict_size() == 1;

			std::string path = single_file ? std::string() : root_dir;
			aux::sanitize_append_path_element(path, filename);

			if (leaf_node)
			{
				if (filename.size() > path.length()
					|| path.substr(path.size() - filename.size()) != filename)
				{
					// if the filename was sanitized and differ, clear it to just use path
					filename = {};
				}

				if (!extract_single_file2(e.second.dict_at(0).second, target
					, path, filename, info_offset, info_buffer, ec))
				{
					return false;
				}
				continue;
			}

			if (!extract_files2(e.second, target, path, info_offset, info_buffer
				, true, depth + 1, ec))
			{
				return false;
			}
		}

		return true;
	}